

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.h
# Opt level: O1

void __thiscall
icu_63::UnicodeSet::exclusiveOr(UnicodeSet *this,UChar32 *other,int32_t otherLen,int8_t polarity)

{
  int32_t iVar1;
  UChar32 *pUVar2;
  UChar32 *pUVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  UChar32 UVar10;
  int iVar11;
  long lVar12;
  bool bVar13;
  UErrorCode status;
  UErrorCode local_2c;
  
  if ((this->stringSpan != (UnicodeSetStringSpan *)0x0 || this->bmpSet != (BMPSet *)0x0) ||
     ((this->fFlags & 1) != 0)) {
    return;
  }
  local_2c = U_ZERO_ERROR;
  ensureBufferCapacity(this,otherLen + this->len,&local_2c);
  if (U_ZERO_ERROR < local_2c) {
    return;
  }
  pUVar2 = this->list;
  iVar7 = *other;
  uVar5 = 1;
  if ((byte)(polarity - 1U) < 2) {
    iVar6 = 0;
    bVar13 = iVar7 != 0;
    iVar7 = 0;
    if (bVar13) goto LAB_002c5061;
    iVar7 = other[1];
  }
  iVar6 = 1;
LAB_002c5061:
  UVar10 = *pUVar2;
  pUVar3 = this->buffer;
  uVar9 = 0;
  do {
    iVar8 = (int)uVar9;
    lVar12 = 0;
    while (iVar11 = (int)lVar12, iVar7 <= UVar10) {
      if (UVar10 <= iVar7) {
        if (UVar10 == 0x110000) {
          pUVar3 = this->buffer;
          pUVar3[iVar8 + lVar12] = 0x110000;
          this->len = iVar8 + iVar11 + 1;
          this->list = pUVar3;
          this->buffer = pUVar2;
          iVar1 = this->capacity;
          this->capacity = this->bufferCapacity;
          this->bufferCapacity = iVar1;
          if (this->pat == (char16_t *)0x0) {
            return;
          }
          uprv_free_63(this->pat);
          this->pat = (char16_t *)0x0;
          this->patLen = 0;
          return;
        }
        uVar9 = (uVar9 & 0xffffffff) + lVar12;
        iVar7 = other[iVar6 + lVar12];
        iVar6 = iVar6 + iVar11 + 1;
        goto LAB_002c50b4;
      }
      pUVar3[iVar8 + lVar12] = iVar7;
      lVar4 = iVar6 + lVar12;
      lVar12 = lVar12 + 1;
      iVar7 = other[lVar4];
    }
    uVar9 = (ulong)(iVar8 + iVar11 + 1);
    pUVar3[iVar8 + lVar12] = UVar10;
    iVar6 = iVar6 + iVar11;
LAB_002c50b4:
    UVar10 = pUVar2[uVar5];
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

inline UBool UnicodeSet::isFrozen() const {
    return (UBool)(bmpSet!=NULL || stringSpan!=NULL);
}